

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

int __thiscall phosg::Poll::remove(Poll *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  ulong uVar4;
  iterator iVar5;
  byte in_DL;
  int __fd;
  bool local_59;
  const_iterator local_50;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> local_48 [2];
  pollfd *local_38;
  pollfd *local_30;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> local_28;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> erase_it;
  pollfd pfd;
  anon_class_1_0_00000001_for__M_comp pred;
  bool close_fd_local;
  int fd_local;
  Poll *this_local;
  
  __fd = (int)__filename;
  erase_it._M_current._0_4_ = __fd;
  local_30 = (pollfd *)
             std::vector<pollfd,_std::allocator<pollfd>_>::begin
                       ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  local_38 = (pollfd *)
             std::vector<pollfd,_std::allocator<pollfd>_>::end
                       ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  local_28 = ::std::
             lower_bound<__gnu_cxx::__normal_iterator<pollfd*,std::vector<pollfd,std::allocator<pollfd>>>,pollfd,phosg::Poll::remove(int,bool)::__0>
                       (local_30,local_38,&erase_it);
  local_48[0]._M_current =
       (pollfd *)
       std::vector<pollfd,_std::allocator<pollfd>_>::end
                 ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  bVar1 = __gnu_cxx::operator==<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                    (&local_28,local_48);
  uVar4 = 0;
  local_59 = false;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
             operator->(&local_28);
    local_59 = ppVar3->fd == __fd;
    uVar4 = (ulong)CONCAT31((int3)((uint)ppVar3->fd >> 8),local_59);
  }
  iVar2 = (int)CONCAT71((int7)(uVar4 >> 8),local_59);
  if (local_59 != false) {
    __gnu_cxx::__normal_iterator<pollfd_const*,std::vector<pollfd,std::allocator<pollfd>>>::
    __normal_iterator<pollfd*>
              ((__normal_iterator<pollfd_const*,std::vector<pollfd,std::allocator<pollfd>>> *)
               &local_50,&local_28);
    iVar5 = std::vector<pollfd,_std::allocator<pollfd>_>::erase
                      ((vector<pollfd,_std::allocator<pollfd>_> *)this,local_50);
    iVar2 = (int)iVar5._M_current;
    if ((in_DL & 1) != 0) {
      iVar2 = close(__fd);
    }
  }
  return iVar2;
}

Assistant:

void Poll::remove(int fd, bool close_fd) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  auto erase_it = lower_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (erase_it != this->poll_fds.end() && erase_it->fd == fd) {
    this->poll_fds.erase(erase_it);
    if (close_fd) {
      close(fd);
    }
  }
}